

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::TruncateStdoutStderr(void)

{
  int iVar1;
  
  iVar1 = 0x100000;
  if (fLI::FLAGS_max_log_size - 1U < 0xfff) {
    iVar1 = fLI::FLAGS_max_log_size << 0x14;
  }
  TruncateLogFile("/proc/self/fd/1",(long)iVar1,0x100000);
  TruncateLogFile("/proc/self/fd/2",(long)iVar1,0x100000);
  return;
}

Assistant:

void TruncateStdoutStderr() {
#ifdef HAVE_UNISTD_H
  int64 limit = MaxLogSize() << 20;
  int64 keep = 1 << 20;
  TruncateLogFile("/proc/self/fd/1", limit, keep);
  TruncateLogFile("/proc/self/fd/2", limit, keep);
#else
  LOG(ERROR) << "No log truncation support.";
#endif
}